

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_heap.h
# Opt level: O2

void __thiscall csbpl_common::Heap<double>::clear(Heap<double> *this)

{
  __shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  *__range2;
  __shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Ptr e;
  __shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  p_Var1 = &((this->data_).
             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((this->data_).
                  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
      ; p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,p_Var2);
    if (local_38._M_ptr != (element_type *)0x0) {
      (local_38._M_ptr)->heap_index_ = -1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  std::
  vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ::clear(&this->data_);
  return;
}

Assistant:

void clear()
  {
    for (Ptr e : data_)
    {
      if (e)
        e->heap_index_ = -1;
    }

    data_.clear();
  }